

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * flatbuffers::dart::DartGenerator::ImportAliasName
                   (string *__return_storage_ptr__,string *ns)

{
  undefined8 local_38;
  size_t pos;
  string *ns_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::assign((string *)__return_storage_ptr__);
  local_38 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
  while (local_38 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,local_38,(char *)0x1);
    local_38 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ImportAliasName(const std::string &ns) {
    std::string ret;
    ret.assign(ns);
    size_t pos = ret.find('.');
    while (pos != std::string::npos) {
      ret.replace(pos, 1, "_");
      pos = ret.find('.', pos + 1);
    }

    return ret;
  }